

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Paged_Device.cxx
# Opt level: O3

void __thiscall
Fl_Paged_Device::print_widget(Fl_Paged_Device *this,Fl_Widget *widget,int delta_x,int delta_y)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  Fl_Window *pFVar5;
  undefined4 extraout_var_00;
  Fl_Plugin *pFVar6;
  int iVar7;
  int old_y;
  int old_x;
  Fl_Plugin_Manager pm;
  int local_50;
  int local_4c;
  Fl_Plugin_Manager local_48;
  long lVar4;
  
  if ((widget->flags_ & 2) != 0) {
    return;
  }
  iVar2 = (*widget->_vptr_Fl_Widget[8])(widget);
  lVar4 = CONCAT44(extraout_var,iVar2);
  bVar1 = widget->damage_;
  Fl_Widget::damage(widget,0x80);
  (*(this->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[9])(this,&local_4c,&local_50);
  iVar7 = delta_x + local_4c;
  iVar2 = delta_y + local_50;
  if (lVar4 == 0) {
    iVar7 = iVar7 - widget->x_;
    iVar2 = iVar2 - widget->y_;
  }
  if (iVar2 != local_50 || iVar7 != local_4c) {
    (*(this->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[0xc])
              (this,(ulong)(uint)(iVar7 - local_4c),(ulong)(uint)(iVar2 - local_50));
  }
  if ((lVar4 != 0) && (pFVar5 = Fl_Widget::window(widget), pFVar5 == (Fl_Window *)0x0)) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,0,0,(ulong)(uint)widget->w_,(ulong)(uint)widget->h_);
  }
  iVar3 = (*widget->_vptr_Fl_Widget[9])(widget);
  if (CONCAT44(extraout_var_00,iVar3) != 0) {
    Fl_Plugin_Manager::Fl_Plugin_Manager(&local_48,"fltk:device");
    pFVar6 = Fl_Plugin_Manager::plugin(&local_48,"opengl.device.fltk.org");
    if (pFVar6 == (Fl_Plugin *)0x0) {
      Fl_Plugin_Manager::~Fl_Plugin_Manager(&local_48);
    }
    else {
      iVar3 = (*pFVar6->_vptr_Fl_Plugin[4])(pFVar6,widget,0,0,0);
      Fl_Plugin_Manager::~Fl_Plugin_Manager(&local_48);
      if (iVar3 != 0) goto LAB_00201c6f;
    }
  }
  (*widget->_vptr_Fl_Widget[2])(widget);
LAB_00201c6f:
  if ((lVar4 != 0) && (pFVar5 = Fl_Widget::window(widget), pFVar5 == (Fl_Window *)0x0)) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  }
  traverse(this,widget);
  if ((iVar7 != local_4c) || (iVar2 != local_50)) {
    (*(this->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[0xd])(this);
  }
  if ((bVar1 & 1) == 0) {
    widget->damage_ = bVar1;
  }
  else {
    Fl_Widget::damage(widget,0x80);
  }
  return;
}

Assistant:

void Fl_Paged_Device::print_widget(Fl_Widget* widget, int delta_x, int delta_y) 
{ 
  int old_x, old_y, new_x, new_y, is_window;
  if ( ! widget->visible() ) return;
  is_window = (widget->as_window() != NULL);
  uchar old_damage = widget->damage();
  widget->damage(FL_DAMAGE_ALL);
  // set origin to the desired top-left position of the widget
  origin(&old_x, &old_y);
  new_x = old_x + delta_x;
  new_y = old_y + delta_y;
  if (!is_window) {
    new_x -= widget->x();
    new_y -= widget->y();
  }
  if (new_x != old_x || new_y != old_y) {
    translate(new_x - old_x, new_y - old_y );
  }
  // if widget is a main window, clip all drawings to the window area
  if (is_window && !widget->window()) {
    fl_push_clip(0, 0, widget->w(), widget->h() );
#ifdef __APPLE__ // for Mac OS X 10.6 and above, make window with rounded bottom corners
    if ( fl_mac_os_version >= 100600 && driver()->class_name() == Fl_Quartz_Graphics_Driver::class_id ) {
      Fl_X::clip_to_rounded_corners(fl_gc, widget->w(), widget->h());
    }
#endif
  }
  // we do some trickery to recognize OpenGL windows and draw them via a plugin
  int drawn_by_plugin = 0;
  if (widget->as_gl_window()) {
    Fl_Plugin_Manager pm("fltk:device");  
    Fl_Device_Plugin *pi = (Fl_Device_Plugin*)pm.plugin("opengl.device.fltk.org");
    if (pi) {
      drawn_by_plugin = pi->print(widget, 0, 0, 0);
    }
  }
  if (!drawn_by_plugin) {
    widget->draw();
  }
  if (is_window && !widget->window()) fl_pop_clip();
  // find subwindows of widget and print them
  traverse(widget);
  // reset origin to where it was
  if (new_x != old_x || new_y != old_y) {
    untranslate();
  }
  if ((old_damage & FL_DAMAGE_CHILD) == 0) widget->clear_damage(old_damage);
  else widget->damage(FL_DAMAGE_ALL);
}